

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  uint8_t uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  run_container_t *prVar13;
  ushort x_00;
  long lVar14;
  uint64_t unaff_R15;
  
  if ((bm->high_low_container).size < 1) {
    uVar9 = 0;
  }
  else {
    uVar10 = x >> 0x10;
    lVar14 = 0;
    uVar8 = 0;
    do {
      uVar1 = (bm->high_low_container).keys[lVar14];
      if (uVar1 < uVar10) {
        prVar13 = (run_container_t *)(bm->high_low_container).containers[lVar14];
        uVar4 = (bm->high_low_container).typecodes[lVar14];
        if (uVar4 == '\x04') {
          uVar4 = *(uint8_t *)&prVar13->runs;
          prVar13 = *(run_container_t **)prVar13;
        }
        if (uVar4 == '\x03') {
          iVar6 = run_container_cardinality(prVar13);
        }
        else {
          iVar6 = prVar13->n_runs;
        }
        uVar8 = uVar8 + (long)iVar6;
      }
      else {
        unaff_R15 = uVar8;
        if (uVar10 == uVar1) {
          prVar13 = (run_container_t *)(bm->high_low_container).containers[lVar14];
          bVar5 = (bm->high_low_container).typecodes[lVar14];
          if (bVar5 == 4) {
            bVar5 = *(byte *)&prVar13->runs;
            prVar13 = *(run_container_t **)prVar13;
          }
          x_00 = (ushort)x;
          if (bVar5 == 3) {
            uVar7 = run_container_rank(prVar13,x_00);
          }
          else if (bVar5 == 2) {
            iVar6 = prVar13->n_runs + -1;
            uVar12 = 0;
            uVar7 = (uint)bVar5;
            do {
              if (iVar6 < (int)uVar12) {
                uVar11 = ~uVar12;
                break;
              }
              uVar11 = uVar12 + iVar6 >> 1;
              uVar2 = *(ushort *)
                       ((long)&prVar13->runs->value + (ulong)(uVar12 + iVar6 & 0xfffffffe));
              if (uVar2 < x_00) {
                uVar12 = uVar11 + 1;
                bVar3 = true;
                uVar11 = uVar7;
              }
              else if (x_00 < uVar2) {
                iVar6 = uVar11 - 1;
                bVar3 = true;
                uVar11 = uVar7;
              }
              else {
                bVar3 = false;
              }
              uVar7 = uVar11;
            } while (bVar3);
            uVar7 = ~uVar11;
            if (-1 < (int)uVar11) {
              uVar7 = uVar11 + 1;
            }
          }
          else {
            uVar7 = bitset_container_rank((bitset_container_t *)prVar13,x_00);
          }
          unaff_R15 = (long)(int)uVar7 + uVar8;
        }
      }
      uVar9 = unaff_R15;
    } while ((uVar1 < uVar10) &&
            (lVar14 = lVar14 + 1, uVar9 = uVar8, lVar14 < (bm->high_low_container).size));
  }
  return uVar9;
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}